

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_dumb_increment.c
# Opt level: O0

int callback_dumb_increment(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  uint uVar1;
  int iVar2;
  lws_vhost *plVar3;
  lws_protocols *plVar4;
  long *plVar5;
  undefined8 *puVar6;
  lws_protocol_vhost_options *plVar7;
  int m;
  int n;
  lws_protocol_vhost_options *opt;
  uint8_t *p;
  uint8_t buf [36];
  vhd__dumb_increment *vhd;
  pss__dumb_increment *pss;
  size_t len_local;
  void *in_local;
  void *user_local;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  plVar3 = lws_get_vhost(wsi);
  plVar4 = lws_get_protocol(wsi);
  plVar5 = (long *)lws_protocol_vh_priv_get(plVar3,plVar4);
  if (reason == LWS_CALLBACK_ESTABLISHED) {
    *(undefined4 *)user = 0;
    if ((*plVar5 == 0) || ((*(uint *)*plVar5 & 1) == 0)) {
      lws_set_timer_usecs(wsi,50000);
    }
  }
  else if (reason == LWS_CALLBACK_RECEIVE) {
    if (5 < len) {
      iVar2 = strncmp((char *)in,"reset\n",6);
      if (iVar2 == 0) {
        *(undefined4 *)user = 0;
      }
      iVar2 = strncmp((char *)in,"closeme\n",8);
      if (iVar2 == 0) {
        _lws_log(4,"dumb_inc: closing as requested\n");
        lws_close_reason(wsi,LWS_CLOSE_STATUS_GOINGAWAY,(uchar *)"seeya",5);
        return -1;
      }
    }
  }
  else if (reason == LWS_CALLBACK_SERVER_WRITEABLE) {
    *(int *)user = *user + 1;
    uVar1 = lws_snprintf((char *)(buf + 8),0x14,"%d");
    iVar2 = lws_write(wsi,buf + 8,(long)(int)uVar1,LWS_WRITE_TEXT);
    if (iVar2 < (int)uVar1) {
      _lws_log(1,"ERROR %d writing to di socket\n",(ulong)uVar1);
      return -1;
    }
  }
  else if (reason == LWS_CALLBACK_PROTOCOL_INIT) {
    plVar3 = lws_get_vhost(wsi);
    plVar4 = lws_get_protocol(wsi);
    puVar6 = (undefined8 *)lws_protocol_vh_priv_zalloc(plVar3,plVar4,8);
    if (puVar6 == (undefined8 *)0x0) {
      return -1;
    }
    plVar7 = lws_pvo_search((lws_protocol_vhost_options *)in,"options");
    if (plVar7 != (lws_protocol_vhost_options *)0x0) {
      *puVar6 = plVar7->value;
    }
  }
  else if ((reason == LWS_CALLBACK_TIMER) && ((*plVar5 == 0 || ((*(uint *)*plVar5 & 1) == 0)))) {
    plVar3 = lws_get_vhost(wsi);
    plVar4 = lws_get_protocol(wsi);
    lws_callback_on_writable_all_protocol_vhost(plVar3,plVar4);
    lws_set_timer_usecs(wsi,50000);
  }
  return 0;
}

Assistant:

static int
callback_dumb_increment(struct lws *wsi, enum lws_callback_reasons reason,
			void *user, void *in, size_t len)
{
	struct pss__dumb_increment *pss = (struct pss__dumb_increment *)user;
	struct vhd__dumb_increment *vhd =
				(struct vhd__dumb_increment *)
				lws_protocol_vh_priv_get(lws_get_vhost(wsi),
						lws_get_protocol(wsi));
	uint8_t buf[LWS_PRE + 20], *p = &buf[LWS_PRE];
	const struct lws_protocol_vhost_options *opt;
	int n, m;

	switch (reason) {
	case LWS_CALLBACK_PROTOCOL_INIT:
		vhd = lws_protocol_vh_priv_zalloc(lws_get_vhost(wsi),
			lws_get_protocol(wsi),
			sizeof(struct vhd__dumb_increment));
		if (!vhd)
			return -1;
		if ((opt = lws_pvo_search(
				(const struct lws_protocol_vhost_options *)in,
				"options")))
			vhd->options = (unsigned int *)opt->value;
		break;

	case LWS_CALLBACK_ESTABLISHED:
		pss->number = 0;
		if (!vhd->options || !((*vhd->options) & 1))
			lws_set_timer_usecs(wsi, DUMB_PERIOD_US);
		break;

	case LWS_CALLBACK_SERVER_WRITEABLE:
		n = lws_snprintf((char *)p, sizeof(buf) - LWS_PRE, "%d",
				 pss->number++);
		m = lws_write(wsi, p, n, LWS_WRITE_TEXT);
		if (m < n) {
			lwsl_err("ERROR %d writing to di socket\n", n);
			return -1;
		}
		break;

	case LWS_CALLBACK_RECEIVE:
		if (len < 6)
			break;
		if (strncmp((const char *)in, "reset\n", 6) == 0)
			pss->number = 0;
		if (strncmp((const char *)in, "closeme\n", 8) == 0) {
			lwsl_notice("dumb_inc: closing as requested\n");
			lws_close_reason(wsi, LWS_CLOSE_STATUS_GOINGAWAY,
					 (unsigned char *)"seeya", 5);
			return -1;
		}
		break;

	case LWS_CALLBACK_TIMER:
		if (!vhd->options || !((*vhd->options) & 1)) {
			lws_callback_on_writable_all_protocol_vhost(
				lws_get_vhost(wsi), lws_get_protocol(wsi));
			lws_set_timer_usecs(wsi, DUMB_PERIOD_US);
		}
		break;

	default:
		break;
	}

	return 0;
}